

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncCloseFunc(xmlCharEncodingHandler *handler)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int local_24;
  int handler_in_list;
  int i;
  int tofree;
  int ret;
  xmlCharEncodingHandler *handler_local;
  
  i = 0;
  bVar2 = false;
  bVar1 = false;
  if (handler == (xmlCharEncodingHandler *)0x0) {
    handler_local._4_4_ = -1;
  }
  else if (handler->name == (char *)0x0) {
    handler_local._4_4_ = -1;
  }
  else {
    if (handlers != (xmlCharEncodingHandlerPtr *)0x0) {
      for (local_24 = 0; local_24 < nbCharEncodingHandler; local_24 = local_24 + 1) {
        if (handler == handlers[local_24]) {
          bVar1 = true;
          break;
        }
      }
    }
    if ((!bVar1) && ((handler->iconv_out != (iconv_t)0x0 || (handler->iconv_in != (iconv_t)0x0)))) {
      bVar2 = true;
      if (handler->iconv_out != (iconv_t)0x0) {
        iVar3 = iconv_close(handler->iconv_out);
        if (iVar3 != 0) {
          i = -1;
        }
        handler->iconv_out = (iconv_t)0x0;
      }
      if (handler->iconv_in != (iconv_t)0x0) {
        iVar3 = iconv_close(handler->iconv_in);
        if (iVar3 != 0) {
          i = -1;
        }
        handler->iconv_in = (iconv_t)0x0;
      }
    }
    if (bVar2) {
      if (handler->name != (char *)0x0) {
        (*xmlFree)(handler->name);
      }
      handler->name = (char *)0x0;
      (*xmlFree)(handler);
    }
    handler_local._4_4_ = i;
  }
  return handler_local._4_4_;
}

Assistant:

int
xmlCharEncCloseFunc(xmlCharEncodingHandler *handler) {
    int ret = 0;
    int tofree = 0;
    int i, handler_in_list = 0;

    if (handler == NULL) return(-1);
    if (handler->name == NULL) return(-1);
    if (handlers != NULL) {
        for (i = 0;i < nbCharEncodingHandler; i++) {
            if (handler == handlers[i]) {
	        handler_in_list = 1;
		break;
	    }
	}
    }
#ifdef LIBXML_ICONV_ENABLED
    /*
     * Iconv handlers can be used only once, free the whole block.
     * and the associated icon resources.
     */
    if ((handler_in_list == 0) &&
        ((handler->iconv_out != NULL) || (handler->iconv_in != NULL))) {
        tofree = 1;
	if (handler->iconv_out != NULL) {
	    if (iconv_close(handler->iconv_out))
		ret = -1;
	    handler->iconv_out = NULL;
	}
	if (handler->iconv_in != NULL) {
	    if (iconv_close(handler->iconv_in))
		ret = -1;
	    handler->iconv_in = NULL;
	}
    }
#endif /* LIBXML_ICONV_ENABLED */
#ifdef LIBXML_ICU_ENABLED
    if ((handler_in_list == 0) &&
        ((handler->uconv_out != NULL) || (handler->uconv_in != NULL))) {
        tofree = 1;
	if (handler->uconv_out != NULL) {
	    closeIcuConverter(handler->uconv_out);
	    handler->uconv_out = NULL;
	}
	if (handler->uconv_in != NULL) {
	    closeIcuConverter(handler->uconv_in);
	    handler->uconv_in = NULL;
	}
    }
#endif
    if (tofree) {
        /* free up only dynamic handlers iconv/uconv */
        if (handler->name != NULL)
            xmlFree(handler->name);
        handler->name = NULL;
        xmlFree(handler);
    }
#ifdef DEBUG_ENCODING
    if (ret)
        xmlGenericError(xmlGenericErrorContext,
		"failed to close the encoding handler\n");
    else
        xmlGenericError(xmlGenericErrorContext,
		"closed the encoding handler\n");
#endif

    return(ret);
}